

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_getBasicIndexNonbasicFlag
          (HModel *this,vector<int,_std::allocator<int>_> *basicIndex_,
          vector<int,_std::allocator<int>_> *nonbasicFlag_)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  int i_1;
  int nonbasicFlagSz;
  int i;
  int basicIndexSz;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750));
  iVar2 = (int)sVar3;
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)iVar5);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar5);
    *pvVar4 = vVar1;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768));
  iVar2 = (int)sVar3;
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)iVar5);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar5);
    *pvVar4 = vVar1;
  }
  return;
}

Assistant:

void HModel::util_getBasicIndexNonbasicFlag(vector<int>& basicIndex_, vector<int>& nonbasicFlag_) {
  basicIndex_.resize(numRow);
  nonbasicFlag_.resize(nonbasicFlag.size());
  int basicIndexSz = basicIndex.size();
  for (int i = 0; i < basicIndexSz; i++) basicIndex_[i] = basicIndex[i];
  int nonbasicFlagSz = nonbasicFlag.size();
  for (int i = 0; i < nonbasicFlagSz; i++) nonbasicFlag_[i] = nonbasicFlag[i];
}